

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O1

int ttf_char_length(ALLEGRO_FONT *f,int ch)

{
  ALLEGRO_TTF_FONT_DATA *data;
  FT_Face_conflict face;
  _Bool _Var1;
  int iVar2;
  ALLEGRO_TTF_GLYPH_DATA *glyph;
  ALLEGRO_TTF_GLYPH_DATA *local_30;
  
  data = (ALLEGRO_TTF_FONT_DATA *)f->data;
  face = data->face;
  iVar2 = FT_Get_Char_Index(face,(long)ch);
  _Var1 = get_glyph(data,iVar2,&local_30);
  if (!_Var1) {
    if (f->fallback != (ALLEGRO_FONT *)0x0) {
      iVar2 = al_get_glyph_width(f,ch);
      return iVar2;
    }
    iVar2 = 0;
    get_glyph(data,0,&local_30);
  }
  cache_glyph(data,face,iVar2,local_30,false);
  return (local_30->region).w + -2;
}

Assistant:

static int ttf_char_length(ALLEGRO_FONT const *f, int ch)
{
   int result;
   ALLEGRO_TTF_FONT_DATA *data = f->data;
   ALLEGRO_TTF_GLYPH_DATA *glyph;
   FT_Face face = data->face;
   int ft_index = FT_Get_Char_Index(face, ch);
   if (!get_glyph(data, ft_index, &glyph)) {
      if (f->fallback) {
         return al_get_glyph_width(f, ch);
      }
      else {
         get_glyph(data, 0, &glyph);
         ft_index = 0;
      }
   }
   cache_glyph(data, face, ft_index, glyph, false);
   result = glyph->region.w - 2;

   return result;
}